

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_find_mv_refs(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mi,MV_REFERENCE_FRAME ref_frame,
                     uint8_t *ref_mv_count,CANDIDATE_MV (*ref_mv_stack) [8],
                     uint16_t (*ref_mv_weight) [8],int_mv (*mv_ref_list) [2],int_mv *global_mvs,
                     int16_t *mode_context)

{
  uint16_t (*ref_mv_weight_00) [8];
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  int iVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  ushort uVar12;
  byte bVar13;
  bool bVar14;
  ushort uVar15;
  int_mv iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int_mv (*paiVar20) [2];
  CANDIDATE_MV *ref_mv_stack_00;
  ulong uVar21;
  int *piVar22;
  int *piVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  int_mv *piVar28;
  uint uVar29;
  bool bVar30;
  int iVar31;
  int iVar32;
  byte bVar33;
  byte bVar34;
  short sVar35;
  uint16_t uVar36;
  int iVar37;
  char cVar38;
  MACROBLOCKD *pMVar39;
  ulong uVar40;
  int iVar41;
  int16_t iVar42;
  long lVar43;
  int row;
  uint uVar44;
  uint uVar45;
  byte *pbVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  CANDIDATE_MV CVar51;
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint8_t row_match_count;
  uint8_t newmv_count;
  uint8_t col_match_count;
  MV_REFERENCE_FRAME rf [2];
  uint8_t dummy_newmv_count;
  uint local_174;
  MACROBLOCKD *local_170;
  WarpedMotionParams *local_168;
  MV_REFERENCE_FRAME local_159;
  byte *local_158;
  int_mv gm_mv [2];
  uint local_138;
  uint local_134;
  uint local_118;
  uint local_114;
  int_mv local_108;
  int local_100 [4];
  ulong local_f0;
  long local_e8;
  int_mv *local_e0;
  int_mv local_d8 [6];
  ulong local_c0;
  int local_b4;
  uint local_b0;
  uint local_ac;
  int tpl_sample_pos [3] [2];
  uint local_78;
  byte bStack_57;
  int_mv ref_diff [2] [2];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  uVar25 = xd->mi_row;
  uVar18 = xd->mi_col;
  lVar19 = (long)ref_frame;
  local_174 = uVar25;
  local_170 = xd;
  local_e8 = lVar19;
  if (ref_frame == '\0') {
    gm_mv[0] = (int_mv)0x0;
    gm_mv[1] = (int_mv)0x0;
    local_108.as_int = 0;
    pbVar46 = ref_mv_count;
    if (global_mvs != (int_mv *)0x0) {
      global_mvs->as_int = 0x80008000;
      pbVar46 = ref_mv_count;
    }
  }
  else {
    bVar47 = (cm->features).allow_high_precision_mv;
    bVar14 = (cm->features).cur_frame_force_integer_mv;
    BVar1 = mi->bsize;
    local_158 = ref_mv_count;
    if (ref_frame < '\b') {
      local_108 = gm_get_motion_vector
                            (cm->global_motion + lVar19,(uint)bVar47,BVar1,uVar18,uVar25,
                             (uint)bVar14);
      gm_mv[1].as_int = 0;
      gm_mv[0].as_int = local_108.as_int;
      pbVar46 = local_158;
      if (global_mvs != (int_mv *)0x0) {
        global_mvs[lVar19] = local_108;
      }
    }
    else {
      cVar38 = ref_frame_map[(byte)ref_frame - 8][1];
      local_108 = gm_get_motion_vector
                            (cm->global_motion + ref_frame_map[(byte)ref_frame - 8][0],(uint)bVar47,
                             BVar1,uVar18,uVar25,(uint)bVar14);
      gm_mv[0].as_int = local_108.as_int;
      iVar16 = gm_get_motion_vector
                         (cm->global_motion + cVar38,(uint)bVar47,BVar1,uVar18,uVar25,(uint)bVar14);
      gm_mv[1].as_int = iVar16.as_int;
      lVar19 = local_e8;
      pbVar46 = local_158;
    }
  }
  uVar25 = local_174;
  pbVar46 = pbVar46 + lVar19;
  paiVar20 = mv_ref_list + lVar19;
  if (mv_ref_list == (int_mv (*) [2])0x0) {
    paiVar20 = (int_mv (*) [2])0x0;
  }
  uVar4 = local_170->width;
  bVar24 = local_170->height;
  bVar13 = bVar24;
  if (bVar24 < (byte)uVar4) {
    bVar13 = uVar4;
  }
  iVar17 = has_top_right((AV1_COMMON *)(ulong)*(uint *)&cm->seq_params->sb_size,local_170,local_174,
                         uVar18,(uint)bVar13);
  bVar24 = bVar24 < 2 & (byte)uVar25;
  local_159 = -1;
  rf[0] = ref_frame;
  if ('\a' < ref_frame) {
    rf[0] = ref_frame_map[(byte)ref_frame - 8][0];
    local_159 = ref_frame_map[(byte)ref_frame - 8][1];
  }
  bVar13 = (byte)uVar4 < 2 & (byte)uVar18;
  rf[1] = local_159;
  mode_context[lVar19] = 0;
  *pbVar46 = 0;
  local_134 = 0;
  local_138 = 0;
  if (local_170->up_available == true) {
    uVar25 = (bVar24 - 6) + (uint)(local_170->height < 2) * 2;
    local_138 = ~local_174 + (local_170->tile).mi_row_end;
    uVar26 = (local_170->tile).mi_row_start - local_174;
    if ((int)uVar25 < (int)local_138) {
      local_138 = uVar25;
    }
    if ((int)uVar25 < (int)uVar26) {
      local_138 = uVar26;
    }
  }
  if (local_170->left_available == true) {
    uVar25 = (bVar13 - 6) + (uint)(local_170->width < 2) * 2;
    local_134 = ~uVar18 + (local_170->tile).mi_col_end;
    uVar26 = (local_170->tile).mi_col_start - uVar18;
    if ((int)uVar25 < (int)local_134) {
      local_134 = uVar25;
    }
    if ((int)uVar25 < (int)uVar26) {
      local_134 = uVar26;
    }
  }
  ref_mv_stack_00 = ref_mv_stack[lVar19];
  ref_mv_weight_00 = ref_mv_weight + lVar19;
  col_match_count = '\0';
  row_match_count = '\0';
  local_114 = 0;
  newmv_count = '\0';
  local_ac = -local_138;
  if (0 < (int)local_138) {
    local_ac = local_138;
  }
  local_118 = 0;
  local_158 = pbVar46;
  if (local_138 != 0) {
    bVar2 = local_170->width;
    uVar25 = (cm->mi_params).mi_cols - uVar18;
    local_168 = (WarpedMotionParams *)CONCAT44(local_168._4_4_,(uint)bVar2);
    if ((int)(uint)bVar2 <= (int)uVar25) {
      uVar25 = (uint)bVar2;
    }
    uVar26 = 0x10;
    if ((int)uVar25 < 0x10) {
      uVar26 = uVar25;
    }
    local_118 = 0;
    if (0 < (int)uVar25) {
      ppMVar6 = local_170->mi;
      iVar31 = local_170->mi_stride;
      local_118 = 0;
      uVar21 = 0;
      do {
        BVar1 = ppMVar6[uVar21 - (long)iVar31]->bsize;
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar1];
        uVar25._0_1_ = local_170->width;
        uVar25._1_1_ = local_170->height;
        uVar25._2_2_ = *(undefined2 *)&local_170->field_0x2076;
        uVar44 = uVar25;
        if (bVar2 <= (byte)(undefined1)uVar25) {
          uVar44 = (uint)bVar2;
        }
        uVar44 = uVar44 & 0xff;
        uVar29 = uVar44;
        if (uVar44 < 5) {
          uVar29 = 4;
        }
        if (0xf < (byte)local_168) {
          uVar44 = uVar29;
        }
        uVar29 = 2;
        if ((1 < (byte)(undefined1)uVar25) && ((byte)(undefined1)uVar25 <= bVar2)) {
          local_118 = -local_138;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [BVar1] <= (int)-local_138) {
            local_118 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar1];
          }
          local_118 = local_118 & 0xffff;
          uVar29 = local_118;
          if (local_118 < 3) {
            uVar29 = 2;
          }
        }
        add_ref_mv_candidate
                  (ppMVar6[uVar21 - (long)iVar31],rf,local_158,&row_match_count,&newmv_count,
                   ref_mv_stack_00,*ref_mv_weight_00,gm_mv,cm->global_motion,
                   (short)uVar29 * (short)uVar44);
        uVar44 = (int)uVar21 + uVar44;
        uVar21 = (ulong)uVar44;
      } while ((int)uVar44 < (int)uVar26);
    }
  }
  local_b0 = -local_134;
  if (0 < (int)local_134) {
    local_b0 = local_134;
  }
  if (local_134 != 0) {
    bVar2 = local_170->height;
    uVar25 = (cm->mi_params).mi_rows - local_174;
    local_168 = (WarpedMotionParams *)CONCAT44(local_168._4_4_,(uint)bVar2);
    if ((int)(uint)bVar2 <= (int)uVar25) {
      uVar25 = (uint)bVar2;
    }
    uVar26 = 0x10;
    if ((int)uVar25 < 0x10) {
      uVar26 = uVar25;
    }
    if (0 < (int)uVar25) {
      local_114 = 0;
      iVar31 = 0;
      do {
        BVar1 = local_170->mi[(long)iVar31 * (long)local_170->mi_stride + -1]->bsize;
        bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar1];
        bVar3 = local_170->height;
        bVar33 = bVar2;
        if (bVar3 < bVar2) {
          bVar33 = bVar3;
        }
        uVar25 = 4;
        if (4 < bVar33) {
          uVar25 = (uint)bVar33;
        }
        if ((byte)local_168 < 0x10) {
          uVar25 = (uint)bVar33;
        }
        uVar44 = 2;
        if ((1 < bVar3) && (bVar3 <= bVar2)) {
          local_114 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar1];
          if ((int)-local_134 <
              (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar1]) {
            local_114 = -local_134;
          }
          uVar44 = 2;
          if (2 < (int)local_114) {
            uVar44 = local_114;
          }
        }
        add_ref_mv_candidate
                  (local_170->mi[(long)iVar31 * (long)local_170->mi_stride + -1],rf,local_158,
                   &col_match_count,&newmv_count,ref_mv_stack_00,*ref_mv_weight_00,gm_mv,
                   cm->global_motion,(short)uVar44 * (short)uVar25);
        iVar31 = iVar31 + uVar25;
      } while (iVar31 < (int)uVar26);
    }
  }
  pbVar46 = local_158;
  uVar25 = local_174;
  if ((iVar17 != 0) && ((local_170->tile).mi_row_start < (int)local_174)) {
    iVar17 = uVar18 + local_170->width;
    if (((local_170->tile).mi_col_start <= iVar17) &&
       (((int)local_174 <= (local_170->tile).mi_row_end && (iVar17 < (local_170->tile).mi_col_end)))
       ) {
      add_ref_mv_candidate
                (local_170->mi[(ulong)local_170->width - (long)local_170->mi_stride],rf,local_158,
                 &row_match_count,&newmv_count,ref_mv_stack_00,*ref_mv_weight_00,gm_mv,
                 cm->global_motion,4);
    }
  }
  local_b4 = ((col_match_count != '\0') + 1) - (uint)(row_match_count == '\0');
  bVar2 = *pbVar46;
  if (bVar2 != 0) {
    uVar21 = 0;
    do {
      (*ref_mv_weight_00)[uVar21] = (*ref_mv_weight_00)[uVar21] + 0x280;
      uVar21 = uVar21 + 1;
    } while (bVar2 != uVar21);
  }
  local_f0 = (ulong)bVar2;
  if ((cm->features).allow_ref_frame_mvs != false) {
    bVar2 = local_170->height;
    tpl_sample_pos[0][0] = 2;
    if (2 < bVar2) {
      tpl_sample_pos[0][0] = (uint)bVar2;
    }
    bVar3 = local_170->width;
    uVar25 = (uint)bVar3;
    tpl_sample_pos[1][1] = 2;
    if (2 < bVar3) {
      tpl_sample_pos[1][1] = (int)bVar3;
    }
    if (0xf < bVar3) {
      uVar25 = 0x10;
    }
    uVar26 = 0x10;
    if (0xf >= bVar2) {
      uVar26 = (uint)bVar2;
    }
    tpl_sample_pos[0][1] = -2;
    tpl_sample_pos[1][0] = tpl_sample_pos[0][0];
    tpl_sample_pos[2][0] = tpl_sample_pos[0][0] - 2;
    tpl_sample_pos[2][1] = tpl_sample_pos[1][1];
    cVar38 = (byte)(bVar3 - 2) < 0xe && (byte)(bVar2 - 2) < 0xe;
    iVar17 = (int)ref_frame;
    local_168 = (WarpedMotionParams *)CONCAT44(local_168._4_4_,iVar17);
    if (bVar2 == 0) {
LAB_0039fd90:
      *(byte *)(mode_context + local_e8) = *(byte *)(mode_context + local_e8) | 8;
    }
    else {
      local_e0 = (int_mv *)CONCAT71(local_e0._1_7_,cVar38);
      local_c0 = CONCAT44(local_c0._4_4_,uVar25);
      iVar31 = 0;
      uVar44 = 0;
      do {
        if (bVar3 != 0) {
          uVar29 = 0;
          do {
            iVar17 = add_tpl_ref_mv(cm,local_170,local_174,uVar18,(MV_REFERENCE_FRAME)iVar17,uVar44,
                                    uVar29,gm_mv,local_158,ref_mv_stack_00,*ref_mv_weight_00,
                                    mode_context);
            if (uVar29 == 0 && uVar44 == 0) {
              iVar31 = iVar17;
            }
            uVar29 = uVar29 + (uint)(0xf < bVar3) * 2 + 2;
            iVar17 = (int)local_168;
          } while (uVar29 < uVar25);
        }
        uVar44 = uVar44 + (uint)(0xf < bVar2) * 2 + 2;
      } while (uVar44 < uVar26);
      cVar38 = (char)local_e0;
      if (iVar31 == 0) goto LAB_0039fd90;
    }
    pbVar46 = local_158;
    uVar25 = local_174;
    if (cVar38 != '\0') {
      uVar26 = local_174 & 0xf;
      lVar43 = 0;
      do {
        if ((tpl_sample_pos[lVar43][0] + uVar26 < 0x10) &&
           (tpl_sample_pos[lVar43][1] + (uVar18 & 0xf) < 0x10)) {
          add_tpl_ref_mv(cm,local_170,local_174,uVar18,(MV_REFERENCE_FRAME)iVar17,
                         tpl_sample_pos[lVar43][0],tpl_sample_pos[lVar43][1],gm_mv,local_158,
                         ref_mv_stack_00,*ref_mv_weight_00,mode_context);
          iVar17 = (int)local_168;
        }
        lVar43 = lVar43 + 1;
        pbVar46 = local_158;
        uVar25 = local_174;
      } while (lVar43 != 3);
    }
  }
  dummy_newmv_count = '\0';
  if (((((local_170->tile).mi_row_start < (int)uVar25) &&
       ((local_170->tile).mi_col_start < (int)uVar18)) &&
      ((int)uVar25 <= (local_170->tile).mi_row_end)) &&
     ((int)uVar18 <= (local_170->tile).mi_col_end)) {
    add_ref_mv_candidate
              (local_170->mi[~(long)local_170->mi_stride],rf,pbVar46,&row_match_count,
               &dummy_newmv_count,ref_mv_stack_00,*ref_mv_weight_00,gm_mv,cm->global_motion,4);
  }
  local_168 = cm->global_motion;
  local_e0 = gm_mv;
  local_c0 = 2;
  pMVar39 = local_170;
  do {
    iVar17 = (int)local_c0 * -2 + 1;
    uVar26 = iVar17 + (uint)bVar24;
    uVar25 = -uVar26;
    if (0 < (int)uVar26) {
      uVar25 = uVar26;
    }
    if ((uVar25 <= local_ac) && ((int)local_118 < (int)uVar25)) {
      bVar2 = pMVar39->width;
      uVar25 = (cm->mi_params).mi_cols - uVar18;
      if ((int)(uint)bVar2 <= (int)uVar25) {
        uVar25 = (uint)bVar2;
      }
      uVar44 = 0x10;
      if ((int)uVar25 < 0x10) {
        uVar44 = uVar25;
      }
      if (0 < (int)uVar25) {
        iVar31 = pMVar39->mi_stride;
        ppMVar6 = pMVar39->mi;
        uVar25 = (uVar26 - local_138) + 1;
        iVar32 = 0;
        do {
          BVar1 = ppMVar6[(long)(int)uVar26 * (long)iVar31 +
                          (ulong)((uint)((uVar18 & 1) == 0 || 1 < bVar2) + iVar32)]->bsize;
          bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [BVar1];
          uVar5 = pMVar39->width;
          bVar33 = bVar3;
          if ((byte)uVar5 < bVar3) {
            bVar33 = uVar5;
          }
          if (bVar2 < 0x10) {
            bVar47 = bVar33 < 3;
            uVar29 = 2;
          }
          else {
            bVar47 = bVar33 < 5;
            uVar29 = 4;
          }
          uVar45 = (uint)bVar33;
          if (bVar47) {
            uVar45 = uVar29;
          }
          sVar35 = 2;
          if ((1 < (byte)uVar5) && ((byte)uVar5 <= bVar3)) {
            local_118 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [BVar1];
            if ((int)uVar25 <
                (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar1]) {
              local_118 = uVar25;
            }
            local_118 = local_118 & 0xffff;
            uVar29 = 2;
            if (2 < local_118) {
              uVar29 = local_118;
            }
            sVar35 = (short)uVar29;
            local_118 = local_118 + ~uVar26;
          }
          add_ref_mv_candidate
                    (ppMVar6[(long)(int)uVar26 * (long)iVar31 +
                             (ulong)((uint)((uVar18 & 1) == 0 || 1 < bVar2) + iVar32)],rf,local_158,
                     &row_match_count,&dummy_newmv_count,ref_mv_stack_00,*ref_mv_weight_00,gm_mv,
                     local_168,sVar35 * (short)uVar45);
          iVar32 = iVar32 + uVar45;
          pMVar39 = local_170;
        } while (iVar32 < (int)uVar44);
      }
    }
    local_78 = (uint)bVar13;
    local_78 = iVar17 + local_78;
    uVar25 = -local_78;
    if (0 < (int)local_78) {
      uVar25 = local_78;
    }
    if ((uVar25 <= local_b0) && ((int)local_114 < (int)uVar25)) {
      uVar25 = local_174 & 1;
      bVar2 = pMVar39->height;
      uVar26 = (cm->mi_params).mi_rows - local_174;
      if ((int)(uint)bVar2 <= (int)uVar26) {
        uVar26 = (uint)bVar2;
      }
      uVar44 = 0x10;
      if ((int)uVar26 < 0x10) {
        uVar44 = uVar26;
      }
      if (0 < (int)uVar26) {
        uVar26 = (local_78 - local_134) + 1;
        iVar17 = 0;
        do {
          BVar1 = pMVar39->mi
                  [(int)(((uint)(uVar25 == 0 || 1 < bVar2) + iVar17) * pMVar39->mi_stride + local_78
                        )]->bsize;
          bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar1];
          bVar33 = pMVar39->height;
          bVar34 = bVar3;
          if (bVar33 < bVar3) {
            bVar34 = bVar33;
          }
          if (bVar2 < 0x10) {
            bVar47 = bVar34 < 3;
            uVar29 = 2;
          }
          else {
            bVar47 = bVar34 < 5;
            uVar29 = 4;
          }
          uVar45 = (uint)bVar34;
          if (bVar47) {
            uVar45 = uVar29;
          }
          sVar35 = 2;
          if ((1 < bVar33) && (bVar33 <= bVar3)) {
            local_114 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [BVar1];
            if ((int)uVar26 <
                (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1]) {
              local_114 = uVar26;
            }
            uVar29 = 2;
            if (2 < (int)local_114) {
              uVar29 = local_114;
            }
            sVar35 = (short)uVar29;
            local_114 = local_114 + ~local_78;
          }
          add_ref_mv_candidate
                    (pMVar39->mi
                     [(int)(((uint)(uVar25 == 0 || 1 < bVar2) + iVar17) * pMVar39->mi_stride +
                           local_78)],rf,local_158,&col_match_count,&dummy_newmv_count,
                     ref_mv_stack_00,*ref_mv_weight_00,gm_mv,local_168,sVar35 * (short)uVar45);
          iVar17 = iVar17 + uVar45;
          pMVar39 = local_170;
        } while (iVar17 < (int)uVar44);
      }
    }
    uVar25 = (int)local_c0 + 1;
    local_c0 = (ulong)uVar25;
  } while (uVar25 != 4);
  if (local_b4 == 0) {
    if (col_match_count != '\0' || row_match_count != '\0') {
      *(byte *)(mode_context + local_e8) = *(byte *)(mode_context + local_e8) | 1;
    }
    if ((row_match_count != '\0') != (col_match_count != '\0')) {
      uVar15 = mode_context[local_e8] | 0x10;
      goto LAB_003a0298;
    }
    if (row_match_count != '\0' && col_match_count != '\0') {
      uVar15 = mode_context[local_e8] | 0x20;
      goto LAB_003a0298;
    }
  }
  else {
    if (local_b4 == 1) {
      uVar15 = (ushort)(newmv_count == '\0') | mode_context[local_e8];
      mode_context[local_e8] = uVar15 | 2;
      if ((row_match_count != '\0') == (col_match_count != '\0')) {
        if (row_match_count == '\0' || col_match_count == '\0') goto LAB_003a029d;
        uVar15 = uVar15 | 0x42;
      }
      else {
        uVar15 = uVar15 | 0x32;
      }
    }
    else {
      uVar15 = (ushort)(newmv_count == '\0') | mode_context[local_e8] | 0x54;
    }
LAB_003a0298:
    mode_context[local_e8] = uVar15;
  }
LAB_003a029d:
  uVar21 = local_f0;
  if (local_f0 != 0) {
    do {
      if ((uint)uVar21 < 2) break;
      uVar36 = (*ref_mv_weight_00)[0];
      uVar40 = 0;
      uVar27 = 1;
      do {
        uVar15 = (*ref_mv_weight_00)[uVar27];
        if (uVar36 < (*ref_mv_weight_00)[uVar27]) {
          auVar49 = *(undefined1 (*) [16])(ref_mv_stack_00 + (uVar27 - 1));
          auVar56._0_8_ = auVar49._8_8_;
          auVar56._8_4_ = auVar49._0_4_;
          auVar56._12_4_ = auVar49._4_4_;
          *(undefined1 (*) [16])(ref_mv_stack_00 + (uVar27 - 1)) = auVar56;
          ref_mv_weight_00[-1][uVar27 + 7] = (*ref_mv_weight_00)[uVar27];
          (*ref_mv_weight_00)[uVar27] = uVar36;
          uVar40 = uVar27 & 0xffffffff;
          uVar15 = uVar36;
        }
        uVar36 = uVar15;
        uVar27 = uVar27 + 1;
      } while ((uVar21 & 0xffffffff) != uVar27);
      uVar21 = uVar40;
    } while (0 < (int)uVar40);
  }
  uVar21 = (ulong)*local_158;
  if ((byte)local_f0 < *local_158) {
    do {
      if ((int)uVar21 <= (int)local_f0 + 1) break;
      uVar27 = uVar21 & 0xffffffff;
      uVar21 = local_f0;
      uVar40 = local_f0 & 0xffffffff;
      do {
        uVar15 = ref_mv_weight[lVar19][uVar40];
        if (uVar15 < ref_mv_weight[lVar19][uVar40 + 1]) {
          auVar49 = *(undefined1 (*) [16])(ref_mv_stack_00 + uVar40);
          auVar48._0_8_ = auVar49._8_8_;
          auVar48._8_4_ = auVar49._0_4_;
          auVar48._12_4_ = auVar49._4_4_;
          *(undefined1 (*) [16])(ref_mv_stack_00 + uVar40) = auVar48;
          ref_mv_weight[lVar19][uVar40] = ref_mv_weight[lVar19][uVar40 + 1];
          ref_mv_weight[lVar19][uVar40 + 1] = uVar15;
          uVar21 = (ulong)((int)uVar40 + 1);
        }
        uVar40 = uVar40 + 1;
      } while (uVar27 - 1 != uVar40);
    } while ((int)local_f0 < (int)uVar21);
  }
  uVar18 = (cm->mi_params).mi_cols - uVar18;
  uVar26._0_1_ = local_170->width;
  uVar26._1_1_ = local_170->height;
  uVar26._2_2_ = *(undefined2 *)&local_170->field_0x2076;
  uVar25 = uVar26;
  if (0xf < (byte)(undefined1)uVar26) {
    uVar25 = 0x10;
  }
  uVar44 = uVar25 & 0xff;
  if ((int)uVar18 < (int)(uVar25 & 0xff)) {
    uVar44 = uVar18;
  }
  uVar25 = 0x10;
  if ((byte)uVar26._1_1_ < 0x10) {
    uVar25 = (uint)(byte)uVar26._1_1_;
  }
  local_174 = (cm->mi_params).mi_rows - local_174;
  if ((int)uVar25 <= (int)local_174) {
    local_174 = uVar25;
  }
  if ((int)uVar44 < (int)local_174) {
    local_174 = uVar44;
  }
  if (-1 < local_159) {
    if (*local_158 < 2) {
      local_100[3] = 0;
      local_100[2] = 0;
      local_100[1] = 0;
      local_100[0] = 0;
      if ((local_138 != 0) && (0 < (int)local_174)) {
        ppMVar6 = local_170->mi;
        iVar17 = 0;
        do {
          pMVar7 = ppMVar6[iVar17 - local_170->mi_stride];
          lVar19 = 0;
          bVar47 = true;
          do {
            bVar14 = bVar47;
            bVar24 = pMVar7->ref_frame[lVar19];
            lVar43 = 0;
            piVar22 = local_100 + 3;
            piVar23 = local_100 + 1;
            bVar47 = true;
            do {
              bVar30 = bVar47;
              if (bVar24 == rf[lVar43]) {
                iVar31 = *piVar22;
                if (1 < (long)iVar31) goto LAB_003a04cc;
                *(int_mv *)(tpl_sample_pos[lVar43] + iVar31) = pMVar7->mv[lVar19];
                piVar23 = piVar22;
LAB_003a0522:
                *piVar23 = iVar31 + 1;
              }
              else {
LAB_003a04cc:
                if ('\0' < (char)bVar24) {
                  iVar31 = *piVar23;
                  if ((long)iVar31 < 2) {
                    auVar49 = ZEXT116(cm->ref_frame_sign_bias[bVar24] ==
                                      cm->ref_frame_sign_bias[rf[lVar43]]);
                    auVar49 = pshuflw(auVar49,auVar49,0);
                    auVar49 = psllw(auVar49,0xf);
                    auVar56 = psraw(auVar49,0xf);
                    auVar49 = ZEXT416(pMVar7->mv[lVar19].as_int) ^ auVar56;
                    ref_diff[lVar43][iVar31].as_mv.row = auVar56._0_2_ - auVar49._0_2_;
                    *(short *)((long)(ref_diff[lVar43] + iVar31) + 2) =
                         auVar56._2_2_ - auVar49._2_2_;
                    goto LAB_003a0522;
                  }
                }
              }
              lVar43 = 1;
              piVar22 = local_100 + 2;
              piVar23 = local_100;
              bVar47 = false;
            } while (bVar30);
            lVar19 = 1;
            bVar47 = false;
          } while (bVar14);
          iVar17 = iVar17 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [pMVar7->bsize];
        } while (iVar17 < (int)local_174);
      }
      if ((local_134 != 0) && (0 < (int)local_174)) {
        ppMVar6 = local_170->mi;
        iVar17 = 0;
        do {
          pMVar7 = ppMVar6[(long)iVar17 * (long)local_170->mi_stride + -1];
          lVar19 = 0;
          bVar47 = true;
          do {
            bVar14 = bVar47;
            bVar24 = pMVar7->ref_frame[lVar19];
            lVar43 = 0;
            piVar22 = local_100 + 3;
            piVar23 = local_100 + 1;
            bVar47 = true;
            do {
              bVar30 = bVar47;
              if (bVar24 == rf[lVar43]) {
                iVar31 = *piVar22;
                if (1 < (long)iVar31) goto LAB_003a0620;
                *(int_mv *)(tpl_sample_pos[lVar43] + iVar31) = pMVar7->mv[lVar19];
                piVar23 = piVar22;
LAB_003a0676:
                *piVar23 = iVar31 + 1;
              }
              else {
LAB_003a0620:
                if ('\0' < (char)bVar24) {
                  iVar31 = *piVar23;
                  if ((long)iVar31 < 2) {
                    auVar49 = ZEXT116(cm->ref_frame_sign_bias[bVar24] ==
                                      cm->ref_frame_sign_bias[rf[lVar43]]);
                    auVar49 = pshuflw(auVar49,auVar49,0);
                    auVar49 = psllw(auVar49,0xf);
                    auVar56 = psraw(auVar49,0xf);
                    auVar49 = ZEXT416(pMVar7->mv[lVar19].as_int) ^ auVar56;
                    ref_diff[lVar43][iVar31].as_mv.row = auVar56._0_2_ - auVar49._0_2_;
                    *(short *)((long)(ref_diff[lVar43] + iVar31) + 2) =
                         auVar56._2_2_ - auVar49._2_2_;
                    goto LAB_003a0676;
                  }
                }
              }
              lVar43 = 1;
              piVar22 = local_100 + 2;
              piVar23 = local_100;
              bVar47 = false;
            } while (bVar30);
            lVar19 = 1;
            bVar47 = false;
          } while (bVar14);
          iVar17 = iVar17 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [pMVar7->bsize];
        } while (iVar17 < (int)local_174);
      }
      lVar19 = 0;
      piVar23 = local_100 + 3;
      piVar22 = local_100 + 1;
      bVar47 = true;
      do {
        bVar14 = bVar47;
        uVar21 = 0;
        if (0 < *piVar23) {
          uVar21 = (ulong)((*piVar23 != 1) + 1);
          uVar40 = 0;
          do {
            local_d8[lVar19 + uVar40 * 2] = *(int_mv *)(tpl_sample_pos[lVar19] + uVar40);
            uVar40 = uVar40 + 1;
          } while (uVar21 != uVar40);
        }
        iVar17 = *piVar22;
        uVar25 = (uint)uVar21;
        if (uVar25 < 2 && 0 < (long)iVar17) {
          uVar40 = 1;
          do {
            uVar27 = uVar21;
            local_d8[uVar27 * 2 + lVar19] = ref_diff[lVar19 + -1][uVar40 + 1];
            if (uVar27 != 0) break;
            bVar47 = uVar40 < (ulong)(long)iVar17;
            uVar40 = uVar40 + 1;
            uVar21 = 1;
          } while (bVar47);
          uVar25 = (int)uVar27 + 1;
        }
        if (uVar25 < 2) {
          iVar16 = *local_e0;
          uVar21 = (ulong)uVar25;
          do {
            local_d8[uVar21 * 2 + lVar19] = iVar16;
            bVar47 = uVar21 == 0;
            uVar21 = 1;
          } while (bVar47);
        }
        lVar19 = 1;
        local_e0 = gm_mv + 1;
        piVar23 = local_100 + 2;
        piVar22 = local_100;
        bVar47 = false;
      } while (bVar14);
      uVar21 = (ulong)*local_158;
      if (uVar21 == 0) {
        bVar24 = 0;
        piVar28 = local_d8;
        bVar47 = true;
        do {
          bVar14 = bVar47;
          ref_mv_stack_00[bVar24].this_mv = *piVar28;
          ref_mv_stack_00[*local_158].comp_mv = piVar28[1];
          (*ref_mv_weight_00)[*local_158] = 2;
          bVar24 = *local_158 + 1;
          *local_158 = bVar24;
          piVar28 = local_d8 + 2;
          bVar47 = false;
        } while (bVar14);
      }
      else {
        if ((local_d8[0].as_int == (ref_mv_stack_00->this_mv).as_int) &&
           (local_d8[1].as_int == (ref_mv_stack_00->comp_mv).as_int)) {
          ref_mv_stack_00[uVar21].this_mv = local_d8[2];
          bVar24 = *local_158;
        }
        else {
          ref_mv_stack_00[uVar21].this_mv.as_int = (uint32_t)local_d8[0];
          bVar24 = *local_158;
          local_d8[3] = local_d8[1];
        }
        ref_mv_stack_00[bVar24].comp_mv = local_d8[3];
        (*ref_mv_weight_00)[*local_158] = 2;
        bVar24 = *local_158 + 1;
        *local_158 = bVar24;
      }
      if (bVar24 == 0) {
        return;
      }
      uVar26._0_1_ = local_170->width;
      uVar26._1_1_ = local_170->height;
      uVar26._2_2_ = *(undefined2 *)&local_170->field_0x2076;
    }
    auVar9[0xc] = (char)(uVar26 >> 0x18);
    auVar9._0_12_ = ZEXT712(0);
    auVar11[1] = 0;
    auVar11[0] = (byte)(uVar26 >> 0x10);
    auVar11._2_3_ = auVar9._10_3_;
    auVar11._5_8_ = 0;
    uVar25 = uVar26 & 0xff;
    iVar17 = (int)CONCAT72(SUB137(auVar11 << 0x40,6),(ushort)(byte)(uVar26 >> 8));
    auVar50._0_4_ = local_170->mb_to_top_edge + iVar17 * -0x20 + -0x80;
    auVar50._4_4_ = local_170->mb_to_left_edge + uVar25 * -0x20 + -0x80;
    auVar50._8_4_ = local_170->mb_to_top_edge + iVar17 * -0x20 + -0x80;
    auVar50._12_4_ = local_170->mb_to_left_edge + uVar25 * -0x20 + -0x80;
    auVar49._0_4_ = local_170->mb_to_bottom_edge + iVar17 * 0x20 + 0x80;
    auVar49._4_4_ = local_170->mb_to_right_edge + uVar25 * 0x20 + 0x80;
    auVar49._8_4_ = local_170->mb_to_bottom_edge + iVar17 * 0x20 + 0x80;
    auVar49._12_4_ = local_170->mb_to_right_edge + uVar25 * 0x20 + 0x80;
    uVar21 = 0;
    do {
      CVar51 = ref_mv_stack_00[uVar21];
      auVar54._8_4_ = 0;
      auVar54._0_4_ = CVar51.this_mv;
      auVar54._4_4_ = CVar51.comp_mv;
      auVar54._12_2_ = CVar51.comp_mv._2_2_;
      auVar54._14_2_ = CVar51.comp_mv._2_2_;
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._8_2_ = 0;
      auVar53._0_4_ = CVar51.this_mv;
      auVar53._4_4_ = CVar51.comp_mv;
      auVar53._10_2_ = CVar51.comp_mv._0_2_;
      auVar52._10_6_ = auVar53._10_6_;
      auVar52._8_2_ = CVar51.comp_mv._0_2_;
      auVar52._0_4_ = CVar51.this_mv;
      auVar52._4_4_ = CVar51.comp_mv;
      auVar10._4_8_ = auVar52._8_8_;
      auVar10._2_2_ = CVar51.this_mv._2_2_;
      auVar10._0_2_ = CVar51.this_mv._2_2_;
      auVar55._0_4_ = (int)CVar51.this_mv._0_2_;
      auVar55._4_4_ = auVar10._0_4_ >> 0x10;
      auVar55._8_4_ = auVar52._8_4_ >> 0x10;
      auVar55._12_4_ = auVar53._12_4_ >> 0x10;
      auVar57._0_4_ = -(uint)(auVar55._0_4_ < auVar50._0_4_);
      auVar57._4_4_ = -(uint)(auVar55._4_4_ < auVar50._4_4_);
      auVar57._8_4_ = -(uint)(auVar55._8_4_ < auVar50._8_4_);
      auVar57._12_4_ = -(uint)(auVar55._12_4_ < auVar50._12_4_);
      auVar58._0_4_ = -(uint)(auVar55._0_4_ < auVar49._0_4_);
      auVar58._4_4_ = -(uint)(auVar55._4_4_ < auVar49._4_4_);
      auVar58._8_4_ = -(uint)(auVar55._8_4_ < auVar49._8_4_);
      auVar58._12_4_ = -(uint)(auVar55._12_4_ < auVar49._12_4_);
      auVar56 = pshuflw(auVar50 & auVar57,
                        ~auVar57 & (~auVar58 & auVar49 | auVar55 & auVar58) | auVar50 & auVar57,0xe8
                       );
      auVar56 = pshufhw(auVar56,auVar56,0xe8);
      CVar51.this_mv.as_int = auVar56._0_4_;
      CVar51.comp_mv.as_int = auVar56._8_4_;
      ref_mv_stack_00[uVar21] = CVar51;
      uVar21 = uVar21 + 1;
    } while (uVar21 < *local_158);
    return;
  }
  bVar24 = *local_158;
  if ((local_138 != 0) && (0 < (int)local_174)) {
    iVar17 = 0;
    do {
      if (1 < bVar24) break;
      pMVar7 = local_170->mi[iVar17 - local_170->mi_stride];
      lVar43 = 0;
      bVar47 = true;
      do {
        bVar14 = bVar47;
        if (0 < (long)pMVar7->ref_frame[lVar43]) {
          uVar15 = *(ushort *)((long)pMVar7->mv + lVar43 * 4 + 2);
          uVar25 = -pMVar7->mv[lVar43].as_int;
          uVar12 = -uVar15;
          if (cm->ref_frame_sign_bias[pMVar7->ref_frame[lVar43]] ==
              cm->ref_frame_sign_bias[local_e8]) {
            uVar25 = pMVar7->mv[lVar43].as_int;
            uVar12 = uVar15;
          }
          uVar21 = (ulong)bVar24;
          if (bVar24 == 0) {
            uVar40 = 0;
LAB_003a08e6:
            if ((uint)uVar40 != (uint)bVar24) goto LAB_003a0905;
          }
          else {
            uVar40 = 0;
            do {
              if ((uVar25 & 0xffff | (uint)uVar12 << 0x10) == ref_mv_stack_00[uVar40].this_mv.as_int
                 ) goto LAB_003a08e6;
              uVar40 = uVar40 + 1;
            } while (uVar21 != uVar40);
          }
          ref_mv_stack_00[uVar21].this_mv.as_mv.row = (int16_t)uVar25;
          ref_mv_stack_00[uVar21].this_mv.as_mv.col = uVar12;
          (*ref_mv_weight_00)[uVar21] = 2;
          bVar24 = *local_158 + 1;
          *local_158 = bVar24;
        }
LAB_003a0905:
        lVar43 = 1;
        bVar47 = false;
      } while (bVar14);
      iVar17 = iVar17 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [pMVar7->bsize];
    } while (iVar17 < (int)local_174);
  }
  if ((local_134 != 0) && (0 < (int)local_174)) {
    iVar17 = 0;
    do {
      if (1 < bVar24) break;
      pMVar7 = local_170->mi[(long)iVar17 * (long)local_170->mi_stride + -1];
      lVar43 = 0;
      bVar47 = true;
      do {
        bVar14 = bVar47;
        if (0 < (long)pMVar7->ref_frame[lVar43]) {
          uVar15 = *(ushort *)((long)pMVar7->mv + lVar43 * 4 + 2);
          uVar25 = -pMVar7->mv[lVar43].as_int;
          uVar12 = -uVar15;
          if (cm->ref_frame_sign_bias[pMVar7->ref_frame[lVar43]] ==
              cm->ref_frame_sign_bias[local_e8]) {
            uVar25 = pMVar7->mv[lVar43].as_int;
            uVar12 = uVar15;
          }
          uVar21 = (ulong)bVar24;
          if (bVar24 == 0) {
            uVar40 = 0;
LAB_003a09d8:
            if ((uint)uVar40 != (uint)bVar24) goto LAB_003a09f7;
          }
          else {
            uVar40 = 0;
            do {
              if ((uVar25 & 0xffff | (uint)uVar12 << 0x10) == ref_mv_stack_00[uVar40].this_mv.as_int
                 ) goto LAB_003a09d8;
              uVar40 = uVar40 + 1;
            } while (uVar21 != uVar40);
          }
          ref_mv_stack_00[uVar21].this_mv.as_mv.row = (int16_t)uVar25;
          ref_mv_stack_00[uVar21].this_mv.as_mv.col = uVar12;
          (*ref_mv_weight_00)[uVar21] = 2;
          bVar24 = *local_158 + 1;
          *local_158 = bVar24;
        }
LAB_003a09f7:
        lVar43 = 1;
        bVar47 = false;
      } while (bVar14);
      iVar17 = iVar17 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [pMVar7->bsize];
    } while (iVar17 < (int)local_174);
  }
  if (bVar24 == 0) {
    if (paiVar20 == (int_mv (*) [2])0x0) {
      return;
    }
    uVar21 = 0;
  }
  else {
    iVar32 = local_170->mb_to_left_edge + (uint)local_170->width * -0x20 + -0x80;
    iVar17 = (uint)local_170->width * 0x20 + local_170->mb_to_right_edge + 0x80;
    iVar37 = local_170->mb_to_top_edge + (uint)local_170->height * -0x20 + -0x80;
    iVar31 = (uint)local_170->height * 0x20 + local_170->mb_to_bottom_edge + 0x80;
    uVar40 = 0;
    do {
      iVar41 = (int)ref_mv_stack[lVar19][uVar40].this_mv.as_mv.col;
      iVar8 = iVar17;
      if (iVar41 < iVar17) {
        iVar8 = iVar41;
      }
      iVar42 = (int16_t)iVar8;
      if (iVar41 < iVar32) {
        iVar42 = (int16_t)iVar32;
      }
      ref_mv_stack[lVar19][uVar40].this_mv.as_mv.col = iVar42;
      iVar41 = (int)ref_mv_stack[lVar19][uVar40].this_mv.as_mv.row;
      iVar8 = iVar31;
      if (iVar41 < iVar31) {
        iVar8 = iVar41;
      }
      iVar42 = (int16_t)iVar8;
      if (iVar41 < iVar37) {
        iVar42 = (int16_t)iVar37;
      }
      ref_mv_stack[lVar19][uVar40].this_mv.as_mv.row = iVar42;
      uVar40 = uVar40 + 1;
      uVar21 = (ulong)*local_158;
    } while (uVar40 < uVar21);
    if (paiVar20 == (int_mv (*) [2])0x0) {
      return;
    }
    if (1 < *local_158) goto LAB_003a0b47;
  }
  do {
    (*paiVar20)[uVar21] = local_108;
    bVar47 = uVar21 == 0;
    uVar21 = 1;
  } while (bVar47);
  if (*local_158 == 0) {
    return;
  }
LAB_003a0b47:
  lVar19 = 0;
  do {
    (*paiVar20)[lVar19] = ref_mv_stack_00[lVar19].this_mv;
    uVar21 = lVar19 + 1;
    bVar24 = *local_158;
    if (1 < *local_158) {
      bVar24 = 2;
    }
    lVar19 = 1;
  } while (uVar21 < bVar24);
  return;
}

Assistant:

void av1_find_mv_refs(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      MB_MODE_INFO *mi, MV_REFERENCE_FRAME ref_frame,
                      uint8_t ref_mv_count[MODE_CTX_REF_FRAMES],
                      CANDIDATE_MV ref_mv_stack[][MAX_REF_MV_STACK_SIZE],
                      uint16_t ref_mv_weight[][MAX_REF_MV_STACK_SIZE],
                      int_mv mv_ref_list[][MAX_MV_REF_CANDIDATES],
                      int_mv *global_mvs, int16_t *mode_context) {
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int_mv gm_mv[2];

  if (ref_frame == INTRA_FRAME) {
    gm_mv[0].as_int = gm_mv[1].as_int = 0;
    if (global_mvs != NULL) {
      global_mvs[ref_frame].as_int = INVALID_MV;
    }
  } else {
    const BLOCK_SIZE bsize = mi->bsize;
    const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
    const int force_integer_mv = cm->features.cur_frame_force_integer_mv;
    if (ref_frame < REF_FRAMES) {
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[ref_frame],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1].as_int = 0;
      if (global_mvs != NULL) global_mvs[ref_frame] = gm_mv[0];
    } else {
      MV_REFERENCE_FRAME rf[2];
      av1_set_ref_frame(rf, ref_frame);
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[rf[0]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1] = gm_get_motion_vector(&cm->global_motion[rf[1]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
    }
  }

  setup_ref_mv_list(cm, xd, ref_frame, &ref_mv_count[ref_frame],
                    ref_mv_stack[ref_frame], ref_mv_weight[ref_frame],
                    mv_ref_list ? mv_ref_list[ref_frame] : NULL, gm_mv, mi_row,
                    mi_col, mode_context);
}